

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fphdlimp.cpp
# Opt level: O0

void __thiscall
icu_63::FieldPositionIteratorHandler::addAttribute
          (FieldPositionIteratorHandler *this,int32_t id,int32_t start,int32_t limit)

{
  UBool UVar1;
  int32_t newSize;
  int32_t size;
  int32_t limit_local;
  int32_t start_local;
  int32_t id_local;
  FieldPositionIteratorHandler *this_local;
  
  if (((this->iter != (FieldPositionIterator *)0x0) &&
      (UVar1 = ::U_SUCCESS(this->status), UVar1 != '\0')) && (start < limit)) {
    newSize = UVector32::size(this->vec);
    UVector32::addElement(this->vec,id,&this->status);
    UVector32::addElement(this->vec,start + (this->super_FieldPositionHandler).fShift,&this->status)
    ;
    UVector32::addElement(this->vec,limit + (this->super_FieldPositionHandler).fShift,&this->status)
    ;
    UVar1 = ::U_SUCCESS(this->status);
    if (UVar1 == '\0') {
      UVector32::setSize(this->vec,newSize);
    }
  }
  return;
}

Assistant:

void
FieldPositionIteratorHandler::addAttribute(int32_t id, int32_t start, int32_t limit) {
  if (iter && U_SUCCESS(status) && start < limit) {
    int32_t size = vec->size();
    vec->addElement(id, status);
    vec->addElement(start + fShift, status);
    vec->addElement(limit + fShift, status);
    if (!U_SUCCESS(status)) {
      vec->setSize(size);
    }
  }
}